

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

bool __thiscall ON_DimStyleExtra::Write(ON_DimStyleExtra *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,3);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_parent_dimstyle);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_valid_fields);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_tolerance_style);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_tolerance_resolution);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_upper_value);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_lower_value);
    if (!bVar1) goto LAB_004cc68a;
    bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_tolerance_height_scale);
  }
  else {
LAB_004cc68a:
    bVar1 = false;
  }
  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar3 < 5) {
    if (bVar1 == false) goto LAB_004cc706;
    dVar4 = this->m_baseline_spacing * this->m_dimscale;
LAB_004cc6c0:
    bVar1 = ON_BinaryArchive::WriteDouble(archive,dVar4);
    if (!bVar1) goto LAB_004cc706;
    bVar1 = ON_BinaryArchive::WriteBool(archive,this->m_bDrawMask);
    if (!bVar1) goto LAB_004cc706;
    bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_mask_color_source);
    if (!bVar1) goto LAB_004cc706;
    bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_mask_color);
  }
  else {
    if (bVar1 != false) {
      dVar4 = this->m_baseline_spacing;
      goto LAB_004cc6c0;
    }
LAB_004cc706:
    bVar1 = false;
  }
  iVar3 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar3 < 5) {
    if (bVar1 != false) {
      dVar4 = 1.0;
LAB_004cc732:
      bVar1 = ON_BinaryArchive::WriteDouble(archive,dVar4);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_dimscale_source);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::WriteUuid(archive,&this->m_source_dimstyle);
          goto LAB_004cc769;
        }
      }
    }
  }
  else if (bVar1 != false) {
    dVar4 = this->m_dimscale;
    goto LAB_004cc732;
  }
  bVar1 = false;
LAB_004cc769:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_DimStyleExtra::Write(ON_BinaryArchive& archive) const
{
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0); Changed to 1,1 for mask settings 12/12/09
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1); Changed to 1,2 for dimscale 12/17/09
//  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2); Changed to 1,3 for source_dimstyle 10/19/10
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,3);

  if(rc) rc = archive.WriteUuid( m_parent_dimstyle);
  if(rc) rc = archive.WriteArray( m_valid_fields);

  if(rc) rc = archive.WriteInt(m_tolerance_style);
  if(rc) rc = archive.WriteInt(m_tolerance_resolution);

  if(rc) rc = archive.WriteDouble(m_tolerance_upper_value);
  if(rc) rc = archive.WriteDouble(m_tolerance_lower_value);
  if(rc) rc = archive.WriteDouble(m_tolerance_height_scale);

  // March 22, 2010 - Global DimStyle was obsoleted and moved into DimStyles
  // So now for writing older version files, its multiplied into all distance values
  if(archive.Archive3dmVersion() < 5)
  {
    if(rc) rc = archive.WriteDouble(m_baseline_spacing * m_dimscale);
  }
  else
  {
    if(rc) rc = archive.WriteDouble(m_baseline_spacing);
  }

  if(rc) rc = archive.WriteBool(m_bDrawMask);
  if(rc) rc = archive.WriteInt(m_mask_color_source);
  if(rc) rc = archive.WriteColor(m_mask_color);

  if(archive.Archive3dmVersion() < 5)
  {
    if(rc) rc = archive.WriteDouble(1.0);
  }
  else
  {
    if(rc) rc = archive.WriteDouble(m_dimscale);
  }
  if(rc) rc = archive.WriteInt(m_dimscale_source); // Obsolete field

  if(rc) rc = archive.WriteUuid(m_source_dimstyle);  // Added 19 Oct 2010

  if(!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}